

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void absl::lts_20250127::base_internal::AddToFreelist(void *v,Arena *arena)

{
  int iVar1;
  AllocList *e;
  uintptr_t uVar2;
  uintptr_t uVar3;
  AllocList *local_128;
  AllocList *prev [30];
  char *absl_raw_log_internal_basename_1;
  char *absl_raw_log_internal_basename;
  AllocList *f;
  Arena *arena_local;
  void *v_local;
  
  e = (AllocList *)((long)v + -0x20);
  uVar3 = *(uintptr_t *)((long)v + -0x18);
  uVar2 = Magic(0x4c833e95,(Header *)e);
  if (uVar3 != uVar2) {
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1ee,"Check %s failed: %s",
               "f->header.magic == Magic(kMagicAllocated, &f->header)",
               "bad magic number in AddToFreelist()");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                  ,0x1ee,"void absl::base_internal::AddToFreelist(void *, LowLevelAlloc::Arena *)");
  }
  if (*(Arena **)((long)v + -0x10) == arena) {
    iVar1 = LLA_SkiplistLevels((e->header).size,arena->min_size,&arena->random);
    *(int *)v = iVar1;
    LLA_SkiplistInsert(&arena->freelist,e,&local_128);
    uVar3 = Magic(0xffffffffb37cc16a,(Header *)e);
    *(uintptr_t *)((long)v + -0x18) = uVar3;
    Coalesce(e);
    Coalesce(local_128);
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1f0,"Check %s failed: %s","f->header.arena == arena",
             "bad arena pointer in AddToFreelist()");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x1f0,"void absl::base_internal::AddToFreelist(void *, LowLevelAlloc::Arena *)");
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                               sizeof(f->header));
  ABSL_RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
                 "bad magic number in AddToFreelist()");
  ABSL_RAW_CHECK(f->header.arena == arena,
                 "bad arena pointer in AddToFreelist()");
  f->levels =
      LLA_SkiplistLevels(f->header.size, arena->min_size, &arena->random);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);        // maybe coalesce with successor
  Coalesce(prev[0]);  // maybe coalesce with predecessor
}